

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_array_refcount.cpp
# Opt level: O3

array_deref_range * __thiscall
ir_array_refcount_visitor::get_array_deref(ir_array_refcount_visitor *this)

{
  uint uVar1;
  array_deref_range *paVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = this->num_derefs;
  uVar1 = this->derefs_size;
  uVar4 = uVar3 + 1;
  if ((ulong)uVar4 * 8 < (ulong)uVar1 || (ulong)uVar4 * 8 - (ulong)uVar1 == 0) {
    paVar2 = this->derefs;
  }
  else {
    paVar2 = (array_deref_range *)reralloc_size(this->mem_ctx,this->derefs,(ulong)(uVar1 + 0x1000));
    if (paVar2 == (array_deref_range *)0x0) {
      return (array_deref_range *)0x0;
    }
    this->derefs_size = this->derefs_size + 0x1000;
    this->derefs = paVar2;
    uVar3 = this->num_derefs;
    uVar4 = uVar3 + 1;
  }
  this->num_derefs = uVar4;
  return paVar2 + uVar3;
}

Assistant:

array_deref_range *
ir_array_refcount_visitor::get_array_deref()
{
   if ((num_derefs + 1) * sizeof(array_deref_range) > derefs_size) {
      void *ptr = reralloc_size(mem_ctx, derefs, derefs_size + 4096);

      if (ptr == NULL)
         return NULL;

      derefs_size += 4096;
      derefs = (array_deref_range *)ptr;
   }

   array_deref_range *d = &derefs[num_derefs];
   num_derefs++;

   return d;
}